

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1491_avgSalary.cpp
# Opt level: O0

double average(vector<int,_std::allocator<int>_> *salary)

{
  size_type sVar1;
  reference pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined4 local_24;
  double dStack_20;
  int i;
  double net;
  int sal_max;
  int sal_min;
  vector<int,_std::allocator<int>_> *salary_local;
  
  net._4_4_ = 1000000;
  net._0_4_ = 1000;
  dStack_20 = 0.0;
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(salary);
    if (sVar1 <= (ulong)(long)local_24) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](salary,(long)local_24);
    dStack_20 = (double)*pvVar2 + dStack_20;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](salary,(long)local_24);
    if (*pvVar2 <= net._4_4_) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](salary,(long)local_24);
      net._4_4_ = *pvVar2;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](salary,(long)local_24);
    if (net._0_4_ <= *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](salary,(long)local_24);
      net._0_4_ = *pvVar2;
    }
    local_24 = local_24 + 1;
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size(salary);
  lVar3 = sVar1 - 2;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  return (dStack_20 - (double)(net._0_4_ + net._4_4_)) /
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
}

Assistant:

double average(vector<int>& salary) {
        int sal_min=1e6, sal_max=1e3;
        double net=0;
        for (int i=0; i<salary.size(); i++)
        {
        	net+=salary[i];
        	if (salary[i]<=sal_min)
        		sal_min=salary[i];
        	if (salary[i]>=sal_max)
        		sal_max=salary[i];
        }
        net-=(sal_max+sal_min);
        net/=(salary.size()-2);
        return net;
    }